

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O0

PatternView * ZXing::QRCode::FindPattern(PatternView *view)

{
  int iVar1;
  undefined8 in_RSI;
  PatternView *in_RDI;
  
  iVar1 = FixedPattern<5,_7,_false>::size((FixedPattern<5,_7,_false> *)PATTERN);
  FindLeftGuard<5,ZXing::QRCode::FindPattern(ZXing::PatternView_const&)::__0>(in_RDI,in_RSI,iVar1);
  return in_RDI;
}

Assistant:

PatternView FindPattern(const PatternView& view)
{
	return FindLeftGuard<PATTERN.size()>(view, PATTERN.size(), [](const PatternView& view, int spaceInPixel) {
		// perform a fast plausability test for 1:1:3:1:1 pattern
		if (view[2] < 2 * std::max(view[0], view[4]) || view[2] < std::max(view[1], view[3]))
			return 0.;
		return IsPattern<E2E>(view, PATTERN, spaceInPixel, 0.1); // the requires 4, here we accept almost 0
	});
}